

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall diff_match_patch_test::testMatchBitap(diff_match_patch_test *this)

{
  int iVar1;
  allocator<wchar_t> local_811;
  wstring local_810 [39];
  allocator<wchar_t> local_7e9;
  wstring local_7e8 [39];
  allocator<wchar_t> local_7c1;
  wstring local_7c0;
  allocator<wchar_t> local_799;
  wstring local_798 [39];
  allocator<wchar_t> local_771;
  wstring local_770 [39];
  allocator<wchar_t> local_749;
  wstring local_748;
  allocator<wchar_t> local_721;
  wstring local_720 [39];
  allocator<wchar_t> local_6f9;
  wstring local_6f8 [39];
  allocator<wchar_t> local_6d1;
  wstring local_6d0;
  allocator<wchar_t> local_6a9;
  wstring local_6a8 [39];
  allocator<wchar_t> local_681;
  wstring local_680 [39];
  allocator<wchar_t> local_659;
  wstring local_658;
  allocator<wchar_t> local_631;
  wstring local_630 [39];
  allocator<wchar_t> local_609;
  wstring local_608 [39];
  allocator<wchar_t> local_5e1;
  wstring local_5e0;
  allocator<wchar_t> local_5b9;
  wstring local_5b8 [39];
  allocator<wchar_t> local_591;
  wstring local_590 [39];
  allocator<wchar_t> local_569;
  wstring local_568;
  allocator<wchar_t> local_541;
  wstring local_540 [39];
  allocator<wchar_t> local_519;
  wstring local_518 [39];
  allocator<wchar_t> local_4f1;
  wstring local_4f0;
  allocator<wchar_t> local_4c9;
  wstring local_4c8 [39];
  allocator<wchar_t> local_4a1;
  wstring local_4a0 [39];
  allocator<wchar_t> local_479;
  wstring local_478;
  allocator<wchar_t> local_451;
  wstring local_450 [39];
  allocator<wchar_t> local_429;
  wstring local_428 [39];
  allocator<wchar_t> local_401;
  wstring local_400;
  allocator<wchar_t> local_3d9;
  wstring local_3d8 [39];
  allocator<wchar_t> local_3b1;
  wstring local_3b0 [39];
  allocator<wchar_t> local_389;
  wstring local_388;
  allocator<wchar_t> local_361;
  wstring local_360 [39];
  allocator<wchar_t> local_339;
  wstring local_338 [39];
  allocator<wchar_t> local_311;
  wstring local_310;
  allocator<wchar_t> local_2e9;
  wstring local_2e8 [39];
  allocator<wchar_t> local_2c1;
  wstring local_2c0 [39];
  allocator<wchar_t> local_299;
  wstring local_298;
  allocator<wchar_t> local_271;
  wstring local_270 [39];
  allocator<wchar_t> local_249;
  wstring local_248 [39];
  allocator<wchar_t> local_221;
  wstring local_220;
  allocator<wchar_t> local_1f9;
  wstring local_1f8 [39];
  allocator<wchar_t> local_1d1;
  wstring local_1d0 [39];
  allocator<wchar_t> local_1a9;
  wstring local_1a8;
  allocator<wchar_t> local_181;
  wstring local_180 [39];
  allocator<wchar_t> local_159;
  wstring local_158 [39];
  allocator<wchar_t> local_131;
  wstring local_130;
  allocator<wchar_t> local_109;
  wstring local_108 [39];
  allocator<wchar_t> local_e1;
  wstring local_e0 [39];
  allocator<wchar_t> local_b9;
  wstring local_b8;
  allocator<wchar_t> local_91;
  wstring local_90 [39];
  allocator<wchar_t> local_69;
  wstring local_68 [55];
  allocator<wchar_t> local_31;
  wstring local_30;
  diff_match_patch_test *local_10;
  diff_match_patch_test *this_local;
  
  *(undefined4 *)&this->field_0xc = 100;
  *(undefined4 *)&this->field_0x8 = 0x3f000000;
  local_10 = this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_30,L"match_bitap: Exact match #1.",&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abcdefghijk",&local_69);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_90,L"fgh",&local_91);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_68,(int)local_90);
  assertEquals(this,&local_30,5,iVar1);
  std::__cxx11::wstring::~wstring(local_90);
  std::allocator<wchar_t>::~allocator(&local_91);
  std::__cxx11::wstring::~wstring(local_68);
  std::allocator<wchar_t>::~allocator(&local_69);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  std::allocator<wchar_t>::~allocator(&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_b8,L"match_bitap: Exact match #2.",&local_b9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_e0,L"abcdefghijk",&local_e1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_108,L"fgh",&local_109);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_e0,(int)local_108);
  assertEquals(this,&local_b8,5,iVar1);
  std::__cxx11::wstring::~wstring(local_108);
  std::allocator<wchar_t>::~allocator(&local_109);
  std::__cxx11::wstring::~wstring(local_e0);
  std::allocator<wchar_t>::~allocator(&local_e1);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  std::allocator<wchar_t>::~allocator(&local_b9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_130,L"match_bitap: Fuzzy match #1.",&local_131);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_158,L"abcdefghijk",&local_159);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_180,L"efxhi",&local_181);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_158,(int)local_180);
  assertEquals(this,&local_130,4,iVar1);
  std::__cxx11::wstring::~wstring(local_180);
  std::allocator<wchar_t>::~allocator(&local_181);
  std::__cxx11::wstring::~wstring(local_158);
  std::allocator<wchar_t>::~allocator(&local_159);
  std::__cxx11::wstring::~wstring((wstring *)&local_130);
  std::allocator<wchar_t>::~allocator(&local_131);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1a8,L"match_bitap: Fuzzy match #2.",&local_1a9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1d0,L"abcdefghijk",&local_1d1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1f8,L"cdefxyhijk",&local_1f9);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_1d0,(int)local_1f8);
  assertEquals(this,&local_1a8,2,iVar1);
  std::__cxx11::wstring::~wstring(local_1f8);
  std::allocator<wchar_t>::~allocator(&local_1f9);
  std::__cxx11::wstring::~wstring(local_1d0);
  std::allocator<wchar_t>::~allocator(&local_1d1);
  std::__cxx11::wstring::~wstring((wstring *)&local_1a8);
  std::allocator<wchar_t>::~allocator(&local_1a9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_220,L"match_bitap: Fuzzy match #3.",&local_221);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_248,L"abcdefghijk",&local_249);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_270,L"bxy",&local_271);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_248,(int)local_270);
  assertEquals(this,&local_220,-1,iVar1);
  std::__cxx11::wstring::~wstring(local_270);
  std::allocator<wchar_t>::~allocator(&local_271);
  std::__cxx11::wstring::~wstring(local_248);
  std::allocator<wchar_t>::~allocator(&local_249);
  std::__cxx11::wstring::~wstring((wstring *)&local_220);
  std::allocator<wchar_t>::~allocator(&local_221);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_298,L"match_bitap: Overflow.",&local_299);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2c0,L"123456789xx0",&local_2c1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2e8,L"3456789x0",&local_2e9);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_2c0,(int)local_2e8);
  assertEquals(this,&local_298,2,iVar1);
  std::__cxx11::wstring::~wstring(local_2e8);
  std::allocator<wchar_t>::~allocator(&local_2e9);
  std::__cxx11::wstring::~wstring(local_2c0);
  std::allocator<wchar_t>::~allocator(&local_2c1);
  std::__cxx11::wstring::~wstring((wstring *)&local_298);
  std::allocator<wchar_t>::~allocator(&local_299);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_310,L"match_bitap: Before start match.",&local_311);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_338,L"abcdef",&local_339);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_360,L"xxabc",&local_361);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_338,(int)local_360);
  assertEquals(this,&local_310,0,iVar1);
  std::__cxx11::wstring::~wstring(local_360);
  std::allocator<wchar_t>::~allocator(&local_361);
  std::__cxx11::wstring::~wstring(local_338);
  std::allocator<wchar_t>::~allocator(&local_339);
  std::__cxx11::wstring::~wstring((wstring *)&local_310);
  std::allocator<wchar_t>::~allocator(&local_311);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_388,L"match_bitap: Beyond end match.",&local_389);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3b0,L"abcdef",&local_3b1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3d8,L"defyy",&local_3d9);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_3b0,(int)local_3d8);
  assertEquals(this,&local_388,3,iVar1);
  std::__cxx11::wstring::~wstring(local_3d8);
  std::allocator<wchar_t>::~allocator(&local_3d9);
  std::__cxx11::wstring::~wstring(local_3b0);
  std::allocator<wchar_t>::~allocator(&local_3b1);
  std::__cxx11::wstring::~wstring((wstring *)&local_388);
  std::allocator<wchar_t>::~allocator(&local_389);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_400,L"match_bitap: Oversized pattern.",&local_401);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_428,L"abcdef",&local_429);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_450,L"xabcdefy",&local_451);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_428,(int)local_450);
  assertEquals(this,&local_400,0,iVar1);
  std::__cxx11::wstring::~wstring(local_450);
  std::allocator<wchar_t>::~allocator(&local_451);
  std::__cxx11::wstring::~wstring(local_428);
  std::allocator<wchar_t>::~allocator(&local_429);
  std::__cxx11::wstring::~wstring((wstring *)&local_400);
  std::allocator<wchar_t>::~allocator(&local_401);
  *(undefined4 *)&this->field_0x8 = 0x3ecccccd;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_478,L"match_bitap: Threshold #1.",&local_479);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_4a0,L"abcdefghijk",&local_4a1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_4c8,L"efxyhi",&local_4c9);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_4a0,(int)local_4c8);
  assertEquals(this,&local_478,4,iVar1);
  std::__cxx11::wstring::~wstring(local_4c8);
  std::allocator<wchar_t>::~allocator(&local_4c9);
  std::__cxx11::wstring::~wstring(local_4a0);
  std::allocator<wchar_t>::~allocator(&local_4a1);
  std::__cxx11::wstring::~wstring((wstring *)&local_478);
  std::allocator<wchar_t>::~allocator(&local_479);
  *(undefined4 *)&this->field_0x8 = 0x3e99999a;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_4f0,L"match_bitap: Threshold #2.",&local_4f1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_518,L"abcdefghijk",&local_519);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_540,L"efxyhi",&local_541);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_518,(int)local_540);
  assertEquals(this,&local_4f0,-1,iVar1);
  std::__cxx11::wstring::~wstring(local_540);
  std::allocator<wchar_t>::~allocator(&local_541);
  std::__cxx11::wstring::~wstring(local_518);
  std::allocator<wchar_t>::~allocator(&local_519);
  std::__cxx11::wstring::~wstring((wstring *)&local_4f0);
  std::allocator<wchar_t>::~allocator(&local_4f1);
  *(undefined4 *)&this->field_0x8 = 0;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_568,L"match_bitap: Threshold #3.",&local_569);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_590,L"abcdefghijk",&local_591);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_5b8,L"bcdef",&local_5b9);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_590,(int)local_5b8);
  assertEquals(this,&local_568,1,iVar1);
  std::__cxx11::wstring::~wstring(local_5b8);
  std::allocator<wchar_t>::~allocator(&local_5b9);
  std::__cxx11::wstring::~wstring(local_590);
  std::allocator<wchar_t>::~allocator(&local_591);
  std::__cxx11::wstring::~wstring((wstring *)&local_568);
  std::allocator<wchar_t>::~allocator(&local_569);
  *(undefined4 *)&this->field_0x8 = 0x3f000000;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_5e0,L"match_bitap: Multiple select #1.",&local_5e1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_608,L"abcdexyzabcde",&local_609);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_630,L"abccde",&local_631);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_608,(int)local_630);
  assertEquals(this,&local_5e0,0,iVar1);
  std::__cxx11::wstring::~wstring(local_630);
  std::allocator<wchar_t>::~allocator(&local_631);
  std::__cxx11::wstring::~wstring(local_608);
  std::allocator<wchar_t>::~allocator(&local_609);
  std::__cxx11::wstring::~wstring((wstring *)&local_5e0);
  std::allocator<wchar_t>::~allocator(&local_5e1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_658,L"match_bitap: Multiple select #2.",&local_659);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_680,L"abcdexyzabcde",&local_681);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_6a8,L"abccde",&local_6a9);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_680,(int)local_6a8);
  assertEquals(this,&local_658,8,iVar1);
  std::__cxx11::wstring::~wstring(local_6a8);
  std::allocator<wchar_t>::~allocator(&local_6a9);
  std::__cxx11::wstring::~wstring(local_680);
  std::allocator<wchar_t>::~allocator(&local_681);
  std::__cxx11::wstring::~wstring((wstring *)&local_658);
  std::allocator<wchar_t>::~allocator(&local_659);
  *(undefined4 *)&this->field_0xc = 10;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_6d0,L"match_bitap: Distance test #1.",&local_6d1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_6f8,L"abcdefghijklmnopqrstuvwxyz",&local_6f9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_720,L"abcdefg",&local_721);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_6f8,(int)local_720);
  assertEquals(this,&local_6d0,-1,iVar1);
  std::__cxx11::wstring::~wstring(local_720);
  std::allocator<wchar_t>::~allocator(&local_721);
  std::__cxx11::wstring::~wstring(local_6f8);
  std::allocator<wchar_t>::~allocator(&local_6f9);
  std::__cxx11::wstring::~wstring((wstring *)&local_6d0);
  std::allocator<wchar_t>::~allocator(&local_6d1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_748,L"match_bitap: Distance test #2.",&local_749);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_770,L"abcdefghijklmnopqrstuvwxyz",&local_771);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_798,L"abcdxxefg",&local_799);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_770,(int)local_798);
  assertEquals(this,&local_748,0,iVar1);
  std::__cxx11::wstring::~wstring(local_798);
  std::allocator<wchar_t>::~allocator(&local_799);
  std::__cxx11::wstring::~wstring(local_770);
  std::allocator<wchar_t>::~allocator(&local_771);
  std::__cxx11::wstring::~wstring((wstring *)&local_748);
  std::allocator<wchar_t>::~allocator(&local_749);
  *(undefined4 *)&this->field_0xc = 1000;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_7c0,L"match_bitap: Distance test #3.",&local_7c1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_7e8,L"abcdefghijklmnopqrstuvwxyz",&local_7e9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_810,L"abcdefg",&local_811);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_7e8,(int)local_810);
  assertEquals(this,&local_7c0,0,iVar1);
  std::__cxx11::wstring::~wstring(local_810);
  std::allocator<wchar_t>::~allocator(&local_811);
  std::__cxx11::wstring::~wstring(local_7e8);
  std::allocator<wchar_t>::~allocator(&local_7e9);
  std::__cxx11::wstring::~wstring((wstring *)&local_7c0);
  std::allocator<wchar_t>::~allocator(&local_7c1);
  return;
}

Assistant:

void diff_match_patch_test::testMatchBitap() {
  // Bitap algorithm.
  dmp.Match_Distance = 100;
  dmp.Match_Threshold = 0.5f;
  assertEquals(L"match_bitap: Exact match #1.", 5, dmp.match_bitap(L"abcdefghijk", L"fgh", 5));

  assertEquals(L"match_bitap: Exact match #2.", 5, dmp.match_bitap(L"abcdefghijk", L"fgh", 0));

  assertEquals(L"match_bitap: Fuzzy match #1.", 4, dmp.match_bitap(L"abcdefghijk", L"efxhi", 0));

  assertEquals(L"match_bitap: Fuzzy match #2.", 2, dmp.match_bitap(L"abcdefghijk", L"cdefxyhijk", 5));

  assertEquals(L"match_bitap: Fuzzy match #3.", -1, dmp.match_bitap(L"abcdefghijk", L"bxy", 1));

  assertEquals(L"match_bitap: Overflow.", 2, dmp.match_bitap(L"123456789xx0", L"3456789x0", 2));

  assertEquals(L"match_bitap: Before start match.", 0, dmp.match_bitap(L"abcdef", L"xxabc", 4));

  assertEquals(L"match_bitap: Beyond end match.", 3, dmp.match_bitap(L"abcdef", L"defyy", 4));

  assertEquals(L"match_bitap: Oversized pattern.", 0, dmp.match_bitap(L"abcdef", L"xabcdefy", 0));

  dmp.Match_Threshold = 0.4f;
  assertEquals(L"match_bitap: Threshold #1.", 4, dmp.match_bitap(L"abcdefghijk", L"efxyhi", 1));

  dmp.Match_Threshold = 0.3f;
  assertEquals(L"match_bitap: Threshold #2.", -1, dmp.match_bitap(L"abcdefghijk", L"efxyhi", 1));

  dmp.Match_Threshold = 0.0f;
  assertEquals(L"match_bitap: Threshold #3.", 1, dmp.match_bitap(L"abcdefghijk", L"bcdef", 1));

  dmp.Match_Threshold = 0.5f;
  assertEquals(L"match_bitap: Multiple select #1.", 0, dmp.match_bitap(L"abcdexyzabcde", L"abccde", 3));

  assertEquals(L"match_bitap: Multiple select #2.", 8, dmp.match_bitap(L"abcdexyzabcde", L"abccde", 5));

  dmp.Match_Distance = 10;  // Strict location.
  assertEquals(L"match_bitap: Distance test #1.", -1, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdefg", 24));

  assertEquals(L"match_bitap: Distance test #2.", 0, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdxxefg", 1));

  dmp.Match_Distance = 1000;  // Loose location.
  assertEquals(L"match_bitap: Distance test #3.", 0, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdefg", 24));
}